

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O2

vector<glcts::_vec2,_std::allocator<glcts::_vec2>_> * __thiscall
glcts::TessellationShaderQuadsInnerTessellationLevelRounding::
getUniqueTessCoordinatesFromVertexDataSet
          (vector<glcts::_vec2,_std::allocator<glcts::_vec2>_> *__return_storage_ptr__,
          TessellationShaderQuadsInnerTessellationLevelRounding *this,float *raw_data,
          uint n_raw_data_vertices)

{
  __normal_iterator<glcts::_vec2_*,_std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>_> _Var1
  ;
  ulong uVar2;
  uint n_vertex;
  uint uVar3;
  value_type local_38;
  
  (__return_storage_ptr__->super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  for (uVar3 = 0; uVar3 < n_raw_data_vertices; uVar3 = uVar3 + 2) {
    local_38 = *(value_type *)(raw_data + uVar2);
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<glcts::_vec2*,std::vector<glcts::_vec2,std::allocator<glcts::_vec2>>>,__gnu_cxx::__ops::_Iter_equals_val<glcts::_vec2_const>>
                      ((__return_storage_ptr__->
                       super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (__return_storage_ptr__->
                       super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>)._M_impl.
                       super__Vector_impl_data._M_finish,&local_38);
    if (_Var1._M_current ==
        (__return_storage_ptr__->super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::push_back
                (__return_storage_ptr__,&local_38);
    }
    uVar2 = (ulong)((int)uVar2 + 6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<_vec2> TessellationShaderQuadsInnerTessellationLevelRounding::getUniqueTessCoordinatesFromVertexDataSet(
	const float* raw_data, const unsigned int n_raw_data_vertices)
{
	std::vector<_vec2> result;

	for (unsigned int n_vertex = 0; n_vertex < n_raw_data_vertices; n_vertex += 2)
	{
		const float* vertex_data = raw_data + n_vertex * 3 /* components */;
		_vec2		 vertex(vertex_data[0], vertex_data[1]);

		if (std::find(result.begin(), result.end(), vertex) == result.end())
		{
			result.push_back(vertex);
		}

	} /* for (all vertices) */

	return result;
}